

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<void>
kj::anon_unknown_0::writeEach(AsyncOutputStream *out,ArrayPtr<const_kj::StringPtr> parts)

{
  TransformPromiseNodeBase *this;
  PromiseNode *in_RCX;
  Disposer *pDVar1;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar2;
  StringPtr *pSVar3;
  Promise<void> PVar4;
  Own<kj::_::PromiseNode> OStack_68;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_48;
  Own<kj::_::PromiseNode> local_38;
  
  pDVar1 = (Disposer *)parts.size_;
  pSVar3 = parts.ptr;
  if (in_RCX == (PromiseNode *)0x0) {
    Promise<void>::Promise((Promise<void> *)out);
    pPVar2 = extraout_RDX_00;
  }
  else {
    (**(code **)(pSVar3->content).ptr)
              (&OStack_68,pSVar3,pDVar1->_vptr_Disposer,(long)pDVar1[1]._vptr_Disposer + -1);
    this = (TransformPromiseNodeBase *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,&OStack_68,
               _::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:406:13),_kj::_::PropagateException>
               ::anon_class_24_2_d933cefb_for_func::operator());
    (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00423770;
    this[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pSVar3;
    this[1].dependency.disposer = pDVar1;
    this[1].dependency.ptr = in_RCX;
    intermediate.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::writeEach(kj::AsyncOutputStream&,kj::ArrayPtr<kj::StringPtr_const>)::$_0,kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)this;
    _::maybeChain<void>(&local_48,(Promise<void> *)&intermediate);
    pPVar2 = local_48.ptr;
    local_38.disposer = local_48.disposer;
    local_48.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_48);
    out->_vptr_AsyncOutputStream = (_func_int **)local_48.disposer;
    out[1]._vptr_AsyncOutputStream = (_func_int **)pPVar2;
    local_38.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_38);
    Own<kj::_::PromiseNode>::dispose(&intermediate);
    Own<kj::_::PromiseNode>::dispose(&OStack_68);
    pPVar2 = extraout_RDX;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar2;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)out;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> writeEach(kj::AsyncOutputStream& out, kj::ArrayPtr<const kj::StringPtr> parts) {
  if (parts.size() == 0) return kj::READY_NOW;

  return out.write(parts[0].begin(), parts[0].size())
      .then([&out,parts]() {
    return writeEach(out, parts.slice(1, parts.size()));
  });
}